

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O1

void __thiscall AlsavoSession::Disconnect(AlsavoSession *this)

{
  ConnectionStatus CVar1;
  Verbosity VVar2;
  double __x;
  initializer_list<unsigned_char> __l;
  allocator_type local_2d;
  ConnectionStatus local_2c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  VVar2 = loguru::current_verbosity_cutoff();
  if (-1 < VVar2) {
    loguru::log(__x);
  }
  if (this->m_ConnectionStatus == Connected) {
    local_2c = 7;
    __l._M_len = 4;
    __l._M_array = (iterator)&local_2c;
    CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_28,__l,&local_2d)
    ;
    SendPacketNow(this,&local_28,0,false,0xf3);
    if ((void *)CONCAT44(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_28.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_28.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_));
    }
  }
  CVar1 = this->m_ConnectionStatus;
  this->m_ConnectionStatus = Disconnected;
  if (CVar1 != Disconnected &&
      (this->m_ConnStatusCB).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    local_2c = CVar1;
    (*(this->m_ConnStatusCB)._M_invoker)
              ((_Any_data *)&this->m_ConnStatusCB,(ConnectionStatus *)&local_28,&local_2c);
  }
  this->m_NextSeq = 0;
  CLI::std::deque<AlsavoSession::PacketQueueItem,_std::allocator<AlsavoSession::PacketQueueItem>_>::
  clear(&this->m_OutQueue);
  if (this->m_Sock != 0) {
    close(this->m_Sock);
    this->m_Sock = 0;
  }
  return;
}

Assistant:

void Disconnect()
	{
		LOG_F(INFO, "Disconnecting.");
		if (m_ConnectionStatus == ConnectionStatus::Connected)
		{
			SendPacketNow({ 0x07, 0, 0, 0 }, 0, false, 0xf3);
		}
		UpdateConnectionStatus(ConnectionStatus::Disconnected);
		m_NextSeq = 0;
		m_OutQueue.clear();
		if (m_Sock != 0)
		{
#ifdef _MSC_VER
			closesocket(m_Sock);
#else
			close(m_Sock);
#endif
			m_Sock = 0;
		}
	}